

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_nfs4.c
# Opt level: O0

void test_acl_nfs4(void)

{
  archive_entry *entry;
  acl_t *p;
  acl_t *in_stack_00000018;
  int i;
  archive_entry *ae;
  char *in_stack_ffffffffffffffd8;
  char *name;
  wchar_t want_type;
  wchar_t in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  acl_t *in_stack_ffffffffffffffe8;
  acl_t *v1;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  wchar_t wVar1;
  
  entry = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_entry_set_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  wVar1 = (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  archive_entry_set_mode(entry,0x81ff);
  set_acls((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
           in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),wVar1);
  wVar1 = L'\0';
  assertion_equal_int((char *)entry,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x12118d,(void *)CONCAT44(p._4_4_,p._0_4_));
  compare_acls(ae,in_stack_00000018,p._4_4_);
  set_acls((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
           in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),wVar1);
  wVar1 = L'\0';
  assertion_equal_int((char *)entry,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1211f9,(void *)CONCAT44(p._4_4_,p._0_4_));
  compare_acls(ae,in_stack_00000018,p._4_4_);
  set_acls((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
           in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),wVar1);
  name = (char *)0x0;
  assertion_equal_int((char *)entry,in_stack_fffffffffffffff4,(longlong)in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x121273,(void *)CONCAT44(p._4_4_,p._0_4_));
  set_acls((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
           in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  for (wVar1 = L'\0'; wVar1 < L'\x06'; wVar1 = wVar1 + L'\x01') {
    v1 = acls_bad + wVar1;
    failure("Malformed ACL test #%d",(ulong)(uint)wVar1);
    archive_entry_acl_add_entry
              ((archive_entry *)CONCAT44(wVar1,in_stack_fffffffffffffff0),
               (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,in_stack_ffffffffffffffe4,
               in_stack_ffffffffffffffe0,name);
    want_type = L'\0';
    assertion_equal_int((char *)entry,wVar1,(longlong)v1,
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x12132c,(void *)CONCAT44(p._4_4_,p._0_4_));
    failure("Malformed ACL test #%d",(ulong)(uint)wVar1);
    archive_entry_acl_reset
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               want_type);
    name = (char *)0x0;
    assertion_equal_int((char *)entry,wVar1,(longlong)v1,
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x12137e,(void *)CONCAT44(p._4_4_,p._0_4_));
  }
  archive_entry_free((archive_entry *)0x121398);
  return;
}

Assistant:

DEFINE_TEST(test_acl_nfs4)
{
	struct archive_entry *ae;
	int i;

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "file");
        archive_entry_set_mode(ae, S_IFREG | 0777);

	/* Store and read back some basic ACL entries. */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	assertEqualInt(4,
	    archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	compare_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));

	/* A more extensive set of ACLs. */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	assertEqualInt(32,
	    archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	compare_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));

	/*
	 * Check that clearing ACLs gets rid of them all by repeating
	 * the first test.
	 */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assertEqualInt(4,
	    archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4));

	/*
	 * Different types of malformed ACL entries that should
	 * fail when added to existing NFS4 ACLs.
	 */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	for (i = 0; i < (int)(sizeof(acls_bad)/sizeof(acls_bad[0])); ++i) {
		struct acl_t *p = &acls_bad[i];
		failure("Malformed ACL test #%d", i);
		assertEqualInt(ARCHIVE_FAILED,
		    archive_entry_acl_add_entry(ae,
			p->type, p->permset, p->tag, p->qual, p->name));
		failure("Malformed ACL test #%d", i);
		assertEqualInt(32,
		    archive_entry_acl_reset(ae,
			ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	}
	archive_entry_free(ae);
}